

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_sub_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  ushort uVar1;
  int iVar2;
  mbedtls_mpi_uint mVar3;
  long lVar4;
  ulong limbs;
  
  limbs = (ulong)B->n;
  if (limbs != 0) {
    do {
      if (B->p[limbs - 1] != 0) goto LAB_00218537;
      limbs = limbs - 1;
    } while (limbs != 0);
    limbs = 0;
  }
LAB_00218537:
  iVar2 = -10;
  if ((limbs <= A->n) && (iVar2 = mbedtls_mpi_grow(X,(ulong)A->n), iVar2 == 0)) {
    lVar4 = A->n - limbs;
    if (A != X && (limbs <= A->n && lVar4 != 0)) {
      memcpy(X->p + limbs,A->p + limbs,lVar4 * 8);
    }
    uVar1 = A->n;
    if (uVar1 < X->n) {
      memset((void *)((ulong)((uint)uVar1 * 8) + (long)X->p),0,((ulong)X->n - (ulong)uVar1) * 8);
    }
    mVar3 = mbedtls_mpi_core_sub(X->p,A->p,B->p,limbs);
    if ((mVar3 != 0) &&
       (mVar3 = mbedtls_mpi_core_sub_int(X->p + limbs,X->p + limbs,mVar3,X->n - limbs), mVar3 != 0))
    {
      return -10;
    }
    X->s = 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_sub_abs(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n;
    mbedtls_mpi_uint carry;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(B != NULL);

    for (n = B->n; n > 0; n--) {
        if (B->p[n - 1] != 0) {
            break;
        }
    }
    if (n > A->n) {
        /* B >= (2^ciL)^n > A */
        ret = MBEDTLS_ERR_MPI_NEGATIVE_VALUE;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, A->n));

    /* Set the high limbs of X to match A. Don't touch the lower limbs
     * because X might be aliased to B, and we must not overwrite the
     * significant digits of B. */
    if (A->n > n && A != X) {
        memcpy(X->p + n, A->p + n, (A->n - n) * ciL);
    }
    if (X->n > A->n) {
        memset(X->p + A->n, 0, (X->n - A->n) * ciL);
    }

    carry = mbedtls_mpi_core_sub(X->p, A->p, B->p, n);
    if (carry != 0) {
        /* Propagate the carry through the rest of X. */
        carry = mbedtls_mpi_core_sub_int(X->p + n, X->p + n, carry, X->n - n);

        /* If we have further carry/borrow, the result is negative. */
        if (carry != 0) {
            ret = MBEDTLS_ERR_MPI_NEGATIVE_VALUE;
            goto cleanup;
        }
    }

    /* X should always be positive as a result of unsigned subtractions. */
    X->s = 1;

cleanup:
    return ret;
}